

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O3

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 in_register_00000034;
  FileWriter *this_00;
  string path;
  string local_78;
  FileWriter *local_58;
  undefined8 uStack_50;
  long local_48;
  _InputArray local_38;
  
  buildPath(&local_78,this,(string *)CONCAT44(in_register_00000034,__fd));
  bVar1 = tryWrite(this,&local_78);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length);
    local_38.sz.width = 0;
    local_38.sz.height = 0;
    local_38.flags = 0x1010000;
    local_48 = 0;
    local_58 = (FileWriter *)0x0;
    uStack_50 = 0;
    local_38.obj = __buf;
    cv::imwrite((string *)&local_78,&local_38,(vector *)&local_58);
    this_00 = local_58;
    if (local_58 != (FileWriter *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skipping (file exists): ",0x18);
    this_00 = (FileWriter *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  logTime(this_00,(Timer *)__n);
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    paVar2 = extraout_RAX;
  }
  return (ssize_t)paVar2;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const cv::Mat& mat,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  cv::imwrite(path, mat);
  logTime(t);
}